

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.hpp
# Opt level: O1

ostream * detail::operator<<(ostream *os,print_hex<char_*> *s)

{
  uint uVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  char *__s;
  size_t sVar4;
  
  uVar1 = *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]);
  std::__ostream_insert<char,std::char_traits<char>>(os,"0x",2);
  pp_Var2 = os->_vptr_basic_ostream;
  p_Var3 = pp_Var2[-3];
  *(uint *)(&os->field_0x18 + (long)p_Var3) =
       *(uint *)(&os->field_0x18 + (long)p_Var3) & 0xffffffb5 | 8;
  __s = s->value;
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)pp_Var2[-3]);
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar4);
  }
  *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) =
       uVar1 & 0x4a | *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) & 0xffffffb5;
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, const print_hex<T> & s) {
	
	std::ios_base::fmtflags old = os.flags();
	
	os << "0x" << std::hex << s.value;
	
	os.setf(old, std::ios_base::basefield);
	return os;
}